

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

Vec_Wec_t * Abc_SopSynthesize(Vec_Ptr_t *vSops)

{
  Abc_Obj_t *pObj;
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Frame_t *pAVar3;
  Vec_Wec_t *pVVar4;
  Vec_Int_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  ulong uVar8;
  Vec_Int_t *p;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  
  pAVar2 = Abc_NtkCreateFromSops("top",vSops);
  uVar8 = 0;
  pAVar3 = Abc_FrameReadGlobalFrame();
  Abc_FrameReplaceCurrentNetwork(pAVar3,pAVar2);
  pAVar3 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar3,"fx; strash; balance; dc2; map -a");
  pAVar3 = Abc_FrameReadGlobalFrame();
  pAVar2 = Abc_FrameReadNtk(pAVar3);
  iVar10 = pAVar2->nObjCounts[7] + pAVar2->vPis->nSize;
  iVar7 = pAVar2->vPos->nSize;
  iVar11 = iVar10 + iVar7;
  pVVar4 = (Vec_Wec_t *)malloc(0x10);
  iVar1 = 8;
  if (6 < (iVar7 + iVar10) - 1U) {
    iVar1 = iVar11;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar1;
  if (iVar1 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar1,0x10);
  }
  pVVar4->pArray = pVVar5;
  pVVar4->nSize = iVar11;
  pVVar6 = pAVar2->vPis;
  if (0 < pVVar6->nSize) {
    uVar8 = 0;
    do {
      *(int *)((long)pVVar6->pArray[uVar8] + 0x40) = (int)uVar8;
      uVar8 = uVar8 + 1;
      pVVar6 = pAVar2->vPis;
    } while ((long)uVar8 < (long)pVVar6->nSize);
  }
  pVVar6 = pAVar2->vObjs;
  if (0 < pVVar6->nSize) {
    lVar9 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar6->pArray[lVar9];
      if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
        iVar7 = (int)uVar8;
        if ((iVar7 < 0) || (iVar11 <= iVar7)) goto LAB_00871a73;
        p = pVVar5 + (uVar8 & 0xffffffff);
        iVar1 = Abc_GateToType(pObj);
        Vec_IntPush(p,iVar1);
        Vec_IntPush(p,iVar7);
        if (0 < (pObj->vFanins).nSize) {
          lVar12 = 0;
          do {
            Vec_IntPush(p,*(int *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar12]] +
                                  0x40));
            lVar12 = lVar12 + 1;
          } while (lVar12 < (pObj->vFanins).nSize);
        }
        (pObj->field_6).iTemp = iVar7;
        uVar8 = (ulong)(iVar7 + 1);
      }
      lVar9 = lVar9 + 1;
      pVVar6 = pAVar2->vObjs;
    } while (lVar9 < pVVar6->nSize);
  }
  iVar11 = (int)uVar8;
  pVVar6 = pAVar2->vPos;
  if (0 < pVVar6->nSize) {
    lVar9 = (uVar8 & 0xffffffff) << 4;
    lVar12 = 0;
    do {
      if ((iVar11 < 0) || (pVVar4->nSize <= iVar11 + (int)lVar12)) {
LAB_00871a73:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar5 = (Vec_Int_t *)((long)&pVVar4->pArray->nCap + lVar9);
      iVar7 = *(int *)(*(long *)(*(long *)(*(long *)(*pVVar6->pArray[lVar12] + 0x20) + 8) +
                                (long)**(int **)((long)pVVar6->pArray[lVar12] + 0x20) * 8) + 0x40);
      Vec_IntPush(pVVar5,0xb);
      Vec_IntPush(pVVar5,iVar7);
      lVar12 = lVar12 + 1;
      pVVar6 = pAVar2->vPos;
      lVar9 = lVar9 + 0x10;
    } while (lVar12 < pVVar6->nSize);
    iVar11 = iVar11 + (int)lVar12;
  }
  if (pVVar4->nSize == iVar11) {
    return pVVar4;
  }
  __assert_fail("Vec_WecSize(vRes) == iNode",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                ,0xc45,"Vec_Wec_t *Abc_SopSynthesize(Vec_Ptr_t *)");
}

Assistant:

Vec_Wec_t * Abc_SopSynthesize( Vec_Ptr_t * vSops )
{
    Vec_Wec_t * vRes = NULL;
    Abc_Ntk_t * pNtk = Abc_NtkCreateFromSops( "top", vSops );
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, iNode = 0;
    Abc_FrameReplaceCurrentNetwork( Abc_FrameReadGlobalFrame(), pNtk );
    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "fx; strash; balance; dc2; map -a" );
    pNtkNew = Abc_FrameReadNtk( Abc_FrameReadGlobalFrame() );
    vRes = Vec_WecStart( Abc_NtkPiNum(pNtkNew) + Abc_NtkNodeNum(pNtkNew) + Abc_NtkPoNum(pNtkNew) );
    Abc_NtkForEachPi( pNtkNew, pObj, i )
        pObj->iTemp = iNode++;
    Abc_NtkForEachNode( pNtkNew, pObj, i )
    {
        Vec_Int_t * vNode = Vec_WecEntry(vRes, iNode);
        Vec_IntPush( vNode, Abc_GateToType(pObj) );
        Vec_IntPush( vNode, iNode );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vNode, pFanin->iTemp );
        pObj->iTemp = iNode++;
    }
    Abc_NtkForEachPo( pNtkNew, pObj, i )
        Vec_IntPushTwo( Vec_WecEntry(vRes, iNode++), ABC_OPER_BIT_BUF, Abc_ObjFanin0(pObj)->iTemp );
    assert( Vec_WecSize(vRes) == iNode );
    return vRes;
}